

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bias.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeBias(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *this;
  uint uVar1;
  string *psVar2;
  string *psVar3;
  pointer pcVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  uint __val;
  pointer plVar8;
  uint uVar9;
  int iVar10;
  Type *pTVar11;
  Type *pTVar12;
  undefined8 *puVar13;
  Type *pTVar14;
  LogMessage *pLVar15;
  AddLayerParams *this_00;
  undefined8 *puVar16;
  long *plVar17;
  LayerUnion this_01;
  WeightParams *pWVar18;
  uint uVar19;
  ulong uVar20;
  pointer plVar21;
  int iVar22;
  BiasParameter *pBVar23;
  uint __len;
  long in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  LogFinisher local_109;
  undefined1 local_108 [56];
  Type *local_d0;
  vector<long,_std::allocator<long>_> local_c8;
  string local_b0;
  Type *local_90;
  RepeatedPtrFieldBase *local_88;
  int local_7c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  BiasParameter *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar10 = getLayerIndex(pTVar11,in_stack_00000030);
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_1._M_dataplus._M_p + 0x70),iVar10);
  pBVar23 = pTVar11->bias_param_;
  if (pBVar23 == (BiasParameter *)0x0) {
    pBVar23 = (BiasParameter *)&caffe::_BiasParameter_default_instance_;
  }
  local_d0 = pTVar11;
  if (1 < (pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_ - 1U) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Must have 1 or 2 input(s)","");
    errorInCaffeProto((string *)local_108,(local_d0->name_).ptr_,(local_d0->type_).ptr_);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
  }
  if ((local_d0->top_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    local_88 = (RepeatedPtrFieldBase *)__str_1._M_string_length;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Must have 1 output","");
    errorInCaffeProto((string *)local_108,(local_d0->name_).ptr_,(local_d0->type_).ptr_);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    local_88 = (RepeatedPtrFieldBase *)__str_1._M_string_length;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((local_d0->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
    }
  }
  pTVar11 = local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_58,
              (value_type *)((local_d0->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  iVar10 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if ((iVar10 == 1) && ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Bias parameters not found.","");
    errorInCaffeProto((string *)local_108,(local_d0->name_).ptr_,(local_d0->type_).ptr_);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
  }
  iVar22 = pBVar23->axis_;
  local_90 = pTVar12;
  if ((iVar22 + 4U < 8) && ((0x99U >> (iVar22 + 4U & 0x1f) & 1) != 0)) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"axis","");
    uVar1 = pBVar23->axis_;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar20 = (ulong)__val;
      uVar9 = 4;
      do {
        __len = uVar9;
        uVar19 = (uint)uVar20;
        if (uVar19 < 100) {
          __len = __len - 2;
          goto LAB_003d1cad;
        }
        if (uVar19 < 1000) {
          __len = __len - 1;
          goto LAB_003d1cad;
        }
        if (uVar19 < 10000) goto LAB_003d1cad;
        uVar20 = uVar20 / 10000;
        uVar9 = __len + 4;
      } while (99999 < uVar19);
      __len = __len + 1;
    }
LAB_003d1cad:
    local_38 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)__str_1.field_2._8_8_;
    psVar2 = (local_d0->name_).ptr_;
    psVar3 = (local_d0->type_).ptr_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_7c = iVar10;
    local_40 = pBVar23;
    std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_b0._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
    unsupportedCaffeParrameterWithOption((string *)local_108,psVar2,psVar3,&local_b0);
    pBVar23 = local_40;
    iVar10 = local_7c;
    pTVar12 = local_90;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    iVar22 = pBVar23->axis_;
    __str_1.field_2._8_8_ = local_38;
  }
  if (iVar22 == 1) {
    if (iVar10 == 1) {
LAB_003d1d8e:
      if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
      }
      puVar13 = *(undefined8 **)
                 ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar13 == (undefined8 *)0x0) {
        puVar13 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar13 + 3) == 2) {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Bias of size 2D when axis = 1 is currently not supported",""
                  );
        errorInCaffeProto((string *)local_108,(local_d0->name_).ptr_,(local_d0->type_).ptr_);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
      }
      iVar22 = pBVar23->axis_;
      goto LAB_003d1e52;
    }
  }
  else {
    if ((iVar10 == 1) && (iVar22 == -3)) goto LAB_003d1d8e;
LAB_003d1e52:
    if (iVar22 != 2) {
      if ((iVar10 == 1) && (iVar22 == -2)) {
LAB_003d200e:
        if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar15 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
        }
        puVar13 = *(undefined8 **)
                   ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar13 == (undefined8 *)0x0) {
          puVar13 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar13 + 3) == 1) {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"Bias of size 1D when axis = 2 is currently not supported",
                     "");
          errorInCaffeProto((string *)local_108,(local_d0->name_).ptr_,(local_d0->type_).ptr_);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
        }
      }
      else if (iVar10 != 1) goto LAB_003d1e75;
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (long *)0x0;
      if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
      }
      puVar13 = *(undefined8 **)
                 ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      puVar16 = puVar13;
      if (puVar13 == (undefined8 *)0x0) {
        puVar16 = &caffe::_BlobShape_default_instance_;
      }
      iVar10 = *(int *)(puVar16 + 3);
      iVar22 = 1;
      if (iVar10 != 0) {
        if (iVar10 == 1) {
          if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
            puVar13 = *(undefined8 **)
                       ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x78);
          }
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &caffe::_BlobShape_default_instance_;
          }
          if (*(int *)(puVar13 + 3) < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          local_b0._M_dataplus._M_p = *(pointer *)(puVar13[4] + 8);
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_b0);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_b0._M_dataplus._M_p;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          iVar22 = (int)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
        }
        else if (iVar10 == 2) {
          if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
            puVar13 = *(undefined8 **)
                       ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x78);
          }
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &caffe::_BlobShape_default_instance_;
          }
          if (*(int *)(puVar13 + 3) < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          local_b0._M_dataplus._M_p = *(pointer *)(puVar13[4] + 8);
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_b0);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_b0._M_dataplus._M_p;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          lVar5 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          puVar13 = *(undefined8 **)
                     ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
          ;
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &caffe::_BlobShape_default_instance_;
          }
          if (*(int *)(puVar13 + 3) < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          local_b0._M_dataplus._M_p = *(pointer *)(puVar13[4] + 0x10);
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_b0);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_b0._M_dataplus._M_p;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          iVar22 = (int)lVar5 *
                   (int)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
        }
        else if (iVar10 - 3U < 2) {
          if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
            puVar13 = *(undefined8 **)
                       ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x78);
          }
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &caffe::_BlobShape_default_instance_;
          }
          plVar17 = google::protobuf::RepeatedField<long>::Get
                              ((RepeatedField<long> *)(puVar13 + 3),iVar10 - 3U);
          local_b0._M_dataplus._M_p = (pointer)*plVar17;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_b0);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_b0._M_dataplus._M_p;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          lVar5 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          puVar13 = *(undefined8 **)
                     ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
          ;
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &caffe::_BlobShape_default_instance_;
          }
          plVar17 = google::protobuf::RepeatedField<long>::Get
                              ((RepeatedField<long> *)(puVar13 + 3),iVar10 + -2);
          local_b0._M_dataplus._M_p = (pointer)*plVar17;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_b0);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_b0._M_dataplus._M_p;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          lVar7 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar15);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          puVar13 = *(undefined8 **)
                     ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78)
          ;
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &caffe::_BlobShape_default_instance_;
          }
          plVar17 = google::protobuf::RepeatedField<long>::Get
                              ((RepeatedField<long> *)(puVar13 + 3),iVar10 + -1);
          local_b0._M_dataplus._M_p = (pointer)*plVar17;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)&local_b0);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = (long)local_b0._M_dataplus._M_p;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          iVar22 = (int)lVar5 * (int)lVar7 *
                   (int)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
          if (iVar10 == 4) {
            if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x5ca);
              pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                  ((LogMessage *)local_108,
                                   "CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
            }
            puVar13 = *(undefined8 **)
                       ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x78);
            if (puVar13 == (undefined8 *)0x0) {
              puVar13 = &caffe::_BlobShape_default_instance_;
            }
            if (*(int *)(puVar13 + 3) < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar15 = google::protobuf::internal::LogMessage::operator<<
                                  ((LogMessage *)local_108,
                                   "CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
            }
            if (*(long *)(puVar13[4] + 8) != 1) {
              local_108._0_8_ = local_108 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"bias","");
              psVar2 = (local_d0->name_).ptr_;
              psVar3 = (local_d0->type_).ptr_;
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b0,"4D bias only supported when 1st dimension is 1","");
              unsupportedCaffeParrameterWithOption((string *)local_108,psVar2,psVar3,&local_b0);
              goto LAB_003d2457;
            }
          }
        }
        else {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"bias","");
          psVar2 = (local_d0->name_).ptr_;
          psVar3 = (local_d0->type_).ptr_;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,">4D bias not supported","");
          unsupportedCaffeParrameterWithOption((string *)local_108,psVar2,psVar3,&local_b0);
LAB_003d2457:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          pTVar12 = local_90;
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
        }
      }
      if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
      }
      pTVar11 = local_d0;
      if (*(int *)((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18) !=
          iVar22) {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Bias blob\'s size inconsistent with the blob dimensions","")
        ;
        errorInCaffeProto((string *)local_108,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
      }
      pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (local_88,(Type *)0x0);
      if ((pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,
                  (value_type *)((pTVar11->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      convertCaffeMetadata
                ((pTVar11->name_).ptr_,&local_78,&local_58,
                 (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_88,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)__str_1.field_2._8_8_);
      if (pTVar14->_oneof_case_[0] == 0xfa) {
        this_01 = pTVar14->layer_;
      }
      else {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar14);
        pTVar14->_oneof_case_[0] = 0xfa;
        this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
        CoreML::Specification::BiasLayerParams::BiasLayerParams(this_01.bias_);
        (pTVar14->layer_).bias_ = (BiasLayerParams *)this_01;
      }
      plVar8 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        plVar21 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          pvVar6 = (void *)*plVar21;
          if ((long)pvVar6 < 0) {
            __assert_fail("dim >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Bias.cpp"
                          ,0x90,
                          "void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters)"
                         );
          }
          iVar10 = ((this_01.convolution_)->kernelsize_).current_size_;
          if (iVar10 == ((this_01.convolution_)->kernelsize_).total_size_) {
            google::protobuf::RepeatedField<unsigned_long>::Reserve
                      (&(this_01.convolution_)->kernelsize_,iVar10 + 1);
            iVar10 = ((this_01.convolution_)->kernelsize_).current_size_;
          }
          pWVar18 = (this_01.innerproduct_)->bias_;
          ((this_01.convolution_)->kernelsize_).current_size_ = iVar10 + 1;
          (&pWVar18->_internal_metadata_)[iVar10].
          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
          .ptr_ = pvVar6;
          plVar21 = plVar21 + 1;
        } while (plVar21 != plVar8);
      }
      pTVar12 = local_90;
      pWVar18 = (this_01.batchnorm_)->variance_;
      if (pWVar18 == (WeightParams *)0x0) {
        pWVar18 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar18);
        (this_01.batchnorm_)->variance_ = pWVar18;
      }
      if (iVar22 < 0) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x46a);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (new_size) >= (0): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
      }
      this = &pWVar18->floatvalue_;
      if (this->current_size_ < iVar22) {
        google::protobuf::RepeatedField<float>::Reserve(this,iVar22);
        iVar10 = this->current_size_;
        if (iVar10 != iVar22) {
          memset(((pWVar18->floatvalue_).rep_)->elements + iVar10,0,
                 (long)iVar22 * 4 + (long)iVar10 * -4);
        }
      }
      this->current_size_ = iVar22;
      if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar15 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
      }
      pvVar6 = ((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
      if ((RepeatedField<float> *)((long)pvVar6 + 0x18) != this) {
        this->current_size_ = 0;
        iVar10 = *(int *)((long)pvVar6 + 0x18);
        if (iVar10 != 0) {
          google::protobuf::RepeatedField<float>::Reserve(this,iVar10);
          memcpy(((pWVar18->floatvalue_).rep_)->elements + (pWVar18->floatvalue_).current_size_,
                 (void *)(*(long *)((long)pvVar6 + 0x20) + 8),
                 (long)*(int *)((long)pvVar6 + 0x18) << 2);
          (pWVar18->floatvalue_).current_size_ =
               (pWVar18->floatvalue_).current_size_ + *(int *)((long)pvVar6 + 0x18);
        }
      }
      goto LAB_003d28e6;
    }
    if (iVar10 == 1) goto LAB_003d200e;
  }
LAB_003d1e75:
  local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (long *)0x0;
  local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_88,(Type *)0x0);
  pTVar12 = local_d0;
  if ((local_d0->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_78,
              (value_type *)((pTVar12->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((pTVar12->bottom_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_108,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_108);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_78,*(value_type **)((pTVar12->bottom_).super_RepeatedPtrFieldBase.rep_ + 1));
  psVar2 = (pTVar12->name_).ptr_;
  pcVar4 = (psVar2->_M_dataplus)._M_p;
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar4,pcVar4 + psVar2->_M_string_length);
  std::__cxx11::string::append(local_108);
  convertCaffeMetadata
            ((string *)local_108,&local_78,&local_58,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_88,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)__str_1.field_2._8_8_);
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (pTVar14->_oneof_case_[0] != 0xe6) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar14);
    pTVar14->_oneof_case_[0] = 0xe6;
    this_00 = (AddLayerParams *)operator_new(0x18);
    CoreML::Specification::AddLayerParams::AddLayerParams(this_00);
    (pTVar14->layer_).add_ = this_00;
  }
LAB_003d28e6:
  if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    const caffe::BiasParameter& caffeLayerParams =  caffeLayer.bias_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Bias layer does not support all the functionality of Caffe Bias layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Bias layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have bias as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "bias" layer
     if bottom_size == 2 => add an MLkit "add" layer.     
     */
    
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (nBottom == 1){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("Bias parameters not found.",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to bias when it is a learned parameter
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob's size inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParams = specLayer->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParams->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_add",
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_add();
    }
}